

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

void Abc_TgReorderFGrps(Abc_TgMan_t *pMan)

{
  char cVar1;
  bool bVar2;
  int local_2c;
  int iStack_20;
  char iv;
  int n;
  int j;
  int i;
  char *pFGrps;
  Abc_TgMan_t *pMan_local;
  
  if (pMan->fPhased == 0) {
    local_2c = (int)pMan->pGroup[0].nGVars;
  }
  else {
    local_2c = 0;
  }
  for (n = 0; n < local_2c; n = n + 1) {
    cVar1 = pMan->pPerm[n];
    iStack_20 = n;
    while( true ) {
      bVar2 = false;
      if (0 < iStack_20) {
        bVar2 = pMan->symPhase[(int)cVar1] < pMan->symPhase[(int)pMan->pFGrps[iStack_20 + -1]];
      }
      if (!bVar2) break;
      pMan->pFGrps[iStack_20] = pMan->pFGrps[iStack_20 + -1];
      iStack_20 = iStack_20 + -1;
    }
    pMan->pFGrps[iStack_20] = cVar1;
  }
  return;
}

Assistant:

static void Abc_TgReorderFGrps(Abc_TgMan_t * pMan)
{
    char * pFGrps = pMan->pFGrps;
    int i, j, n = pMan->fPhased ? 0 : pMan->pGroup->nGVars;

    // sort by symPhase
    for (i = 0; i < n; i++)
    {
        char iv = pMan->pPerm[i];
        for (j = i; j > 0 && pMan->symPhase[(int)pFGrps[j - 1]] > pMan->symPhase[(int)iv]; j--)
            pFGrps[j] = pFGrps[j - 1];
        pFGrps[j] = iv;
    }
}